

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeKineticCorrFunc.cpp
# Opt level: O3

int __thiscall
OpenMD::ChargeKineticCorrFunc::computeProperty2
          (ChargeKineticCorrFunc *this,int frame,StuntDouble *sd)

{
  undefined4 *puVar1;
  vector<double,std::allocator<double>> *this_00;
  int iVar2;
  DataStoragePointer DVar3;
  Snapshot *pSVar4;
  iterator __position;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  pointer pvVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Mat3x3d I;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double local_b8;
  double local_b0;
  double local_a8 [18];
  
  DVar3 = sd->storage_;
  pSVar4 = sd->snapshotMan_->currentSnapshot_;
  lVar11 = (long)sd->localIndex_;
  lVar6 = *(long *)((long)&(pSVar4->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar3);
  lVar5 = lVar11 * 0x18;
  pdVar8 = (double *)(lVar6 + lVar5);
  dVar12 = *pdVar8;
  dVar13 = pdVar8[1];
  (this->pos2_).super_Vector<double,_3U>.data_[2] = *(double *)(lVar6 + 0x10 + lVar5);
  (this->pos2_).super_Vector<double,_3U>.data_[0] = dVar12;
  (this->pos2_).super_Vector<double,_3U>.data_[1] = dVar13;
  lVar6 = *(long *)((long)&(pSVar4->atomData).velocity.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar3);
  dVar12 = *(double *)(lVar6 + 8 + lVar5);
  dVar13 = *(double *)(lVar6 + 0x10 + lVar5);
  dVar12 = (dVar13 * dVar13 +
           *(double *)(lVar6 + lVar5) * *(double *)(lVar6 + lVar5) + dVar12 * dVar12) * sd->mass_ +
           0.0;
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[8] = 0.0;
  if (sd->objType_ - otDAtom < 2) {
    lVar6 = *(long *)((long)&(pSVar4->atomData).angularMomentum.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar3);
    local_b8 = *(double *)(lVar6 + 0x10 + lVar11 * 0x18);
    puVar1 = (undefined4 *)(lVar6 + lVar11 * 0x18);
    local_c8 = *puVar1;
    uStack_c4 = puVar1[1];
    uStack_c0 = puVar1[2];
    uStack_bc = puVar1[3];
    local_b0 = dVar12;
    (*sd->_vptr_StuntDouble[5])(local_a8 + 9,sd);
    lVar6 = 0;
    do {
      *(undefined8 *)((long)local_a8 + lVar6 + 0x10) =
           *(undefined8 *)((long)local_a8 + lVar6 + 0x58);
      *(undefined8 *)((long)local_a8 + lVar6) = *(undefined8 *)((long)local_a8 + lVar6 + 0x48);
      *(undefined8 *)((long)local_a8 + lVar6 + 8) = *(undefined8 *)((long)local_a8 + lVar6 + 0x50);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    if (sd->linear_ == true) {
      iVar2 = sd->linearAxis_;
      uVar9 = (ulong)(((iVar2 + 1) / 3) * -3 + iVar2 + 1);
      uVar7 = (ulong)(iVar2 + ((iVar2 + 2) / 3) * -3 + 2);
      dVar12 = (*(double *)(&local_c8 + uVar9 * 2) * *(double *)(&local_c8 + uVar9 * 2)) /
               local_a8[uVar9 * 4];
      dVar13 = *(double *)(&local_c8 + uVar7 * 2) * *(double *)(&local_c8 + uVar7 * 2);
      pdVar8 = local_a8 + uVar7 * 4;
    }
    else {
      pdVar8 = local_a8 + 8;
      auVar14._0_8_ = (double)CONCAT44(uStack_c4,local_c8) * (double)CONCAT44(uStack_c4,local_c8);
      auVar14._8_8_ = (double)CONCAT44(uStack_bc,uStack_c0) * (double)CONCAT44(uStack_bc,uStack_c0);
      auVar15._8_4_ = SUB84(local_a8[4],0);
      auVar15._0_8_ = local_a8[0];
      auVar15._12_4_ = (int)((ulong)local_a8[4] >> 0x20);
      auVar15 = divpd(auVar14,auVar15);
      dVar12 = auVar15._8_8_ + auVar15._0_8_;
      dVar13 = local_b8 * local_b8;
    }
    dVar12 = local_b0 + dVar13 / *pdVar8 + dVar12;
  }
  this->propertyTemp = dVar12 * 0.5;
  pvVar10 = (this->kinetic_).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (vector<double,std::allocator<double>> *)(pvVar10 + frame);
  __position._M_current = *(double **)(this_00 + 8);
  if (__position._M_current == *(double **)(this_00 + 0x10)) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              (this_00,__position,&this->propertyTemp);
    pvVar10 = (this->kinetic_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar8 = pvVar10[frame].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = dVar12 * 0.5;
    pdVar8 = __position._M_current + 1;
    *(double **)(this_00 + 8) = pdVar8;
  }
  this->sumKinetic_ = this->propertyTemp + this->sumKinetic_;
  this->kineticCount_ = this->kineticCount_ + 1;
  return (int)((ulong)((long)pdVar8 -
                      *(long *)&pvVar10[frame].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data) >> 3) + -1;
}

Assistant:

int ChargeKineticCorrFunc::computeProperty2(int frame, StuntDouble* sd) {
    RealType kinetic(0.0);
    pos2_ = sd->getPos();

    RealType mass = sd->getMass();
    Vector3d vel  = sd->getVel();

    kinetic += mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

    Vector3d angMom;
    Mat3x3d I;
    int i, j, k;

    if (sd->isDirectional()) {
      angMom = sd->getJ();
      I      = sd->getI();

      if (sd->isLinear()) {
        i = sd->linearAxis();
        j = (i + 1) % 3;
        k = (i + 2) % 3;
        kinetic +=
            angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
      } else {
        kinetic += angMom[0] * angMom[0] / I(0, 0) +
                   angMom[1] * angMom[1] / I(1, 1) +
                   angMom[2] * angMom[2] / I(2, 2);
      }
    }
    propertyTemp = 0.5 * kinetic;
    kinetic_[frame].push_back(propertyTemp);
    sumKinetic_ += propertyTemp;
    kineticCount_++;
    return kinetic_[frame].size() - 1;
  }